

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_sets.h
# Opt level: O2

TargetBits
highwayhash::InstructionSets::
RunAll<highwayhash::HighwayHashCatTest,_const_unsigned_long_(&)[4],_char_(&)[105],_const_unsigned_int_&,_unsigned_long_(*)[2],_void_(*)(const_char_*,_unsigned_long)>
          (unsigned_long (*args) [4],char (*args_1) [105],uint *args_2,unsigned_long (**args_3) [2],
          _func_void_char_ptr_unsigned_long **args_4)

{
  TargetBits TVar1;
  HighwayHashCatTest<1U> local_33;
  HighwayHashCatTest<2U> local_32;
  HighwayHashCatTest<4U> local_31;
  
  TVar1 = Supported();
  if ((TVar1 & 4) != 0) {
    HighwayHashCatTest<4U>::operator()
              (&local_31,(HHKey *)args,*args_1,(ulong)*args_2,(HHResult128 *)*args_3,
               (HHNotify)*args_4);
  }
  if ((TVar1 & 2) != 0) {
    HighwayHashCatTest<2U>::operator()
              (&local_32,(HHKey *)args,*args_1,(ulong)*args_2,(HHResult128 *)*args_3,
               (HHNotify)*args_4);
  }
  HighwayHashCatTest<1U>::operator()
            (&local_33,(HHKey *)args,*args_1,(ulong)*args_2,(HHResult128 *)*args_3,(HHNotify)*args_4
            );
  return TVar1;
}

Assistant:

static HH_INLINE TargetBits RunAll(Args&&... args) {
    const TargetBits supported = Supported();

#if HH_ARCH_X64
    if (supported & HH_TARGET_AVX2) {
      Func<HH_TARGET_AVX2>()(std::forward<Args>(args)...);
    }
    if (supported & HH_TARGET_SSE41) {
      Func<HH_TARGET_SSE41>()(std::forward<Args>(args)...);
    }
#elif HH_ARCH_PPC
    if (supported & HH_TARGET_VSX) {
      Func<HH_TARGET_VSX>()(std::forward<Args>(args)...);
    }

#elif HH_ARCH_NEON
    if (supported & HH_TARGET_NEON) {
      Func<HH_TARGET_NEON>()(std::forward<Args>(args)...);
    }
#endif

    Func<HH_TARGET_Portable>()(std::forward<Args>(args)...);

    return supported;  // i.e. all that were run
  }